

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_pool32axf_2_multiply
               (DisasContext_conflict6 *ctx,uint32_t opc,TCGv_i64 v0,TCGv_i64 v1,int rd)

{
  TCGContext_conflict6 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i32 ret;
  TCGv_i32 t0;
  TCGContext_conflict6 *tcg_ctx;
  int rd_local;
  TCGv_i64 v1_local;
  TCGv_i64 v0_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx_00);
  tcg_gen_movi_i32(tcg_ctx_00,ret,rd >> 3);
  switch(opc) {
  case 0:
    uVar1 = extract32(ctx->opcode,9,3);
    switch(uVar1) {
    case 0:
      check_dsp_r2(ctx);
      gen_helper_dpa_w_ph(tcg_ctx_00,ret,v1,v0,tcg_ctx_00->cpu_env);
      break;
    case 1:
      check_dsp(ctx);
      gen_helper_dpaq_s_w_ph(tcg_ctx_00,ret,v1,v0,tcg_ctx_00->cpu_env);
      break;
    case 2:
      check_dsp_r2(ctx);
      gen_helper_dps_w_ph(tcg_ctx_00,ret,v1,v0,tcg_ctx_00->cpu_env);
      break;
    case 3:
      check_dsp(ctx);
      gen_helper_dpsq_s_w_ph(tcg_ctx_00,ret,v1,v0,tcg_ctx_00->cpu_env);
      break;
    default:
      generate_exception_end(ctx,0x14);
    }
    break;
  case 1:
    uVar1 = extract32(ctx->opcode,9,3);
    switch(uVar1) {
    case 0:
      check_dsp_r2(ctx);
      gen_helper_dpax_w_ph(tcg_ctx_00,ret,v0,v1,tcg_ctx_00->cpu_env);
      break;
    case 1:
      check_dsp(ctx);
      gen_helper_dpaq_sa_l_w(tcg_ctx_00,ret,v0,v1,tcg_ctx_00->cpu_env);
      break;
    case 2:
      check_dsp_r2(ctx);
      gen_helper_dpsx_w_ph(tcg_ctx_00,ret,v0,v1,tcg_ctx_00->cpu_env);
      break;
    case 3:
      check_dsp(ctx);
      gen_helper_dpsq_sa_l_w(tcg_ctx_00,ret,v0,v1,tcg_ctx_00->cpu_env);
      break;
    default:
      generate_exception_end(ctx,0x14);
    }
    break;
  case 2:
    uVar1 = extract32(ctx->opcode,9,3);
    switch(uVar1) {
    case 0:
      check_dsp(ctx);
      gen_helper_dpau_h_qbl(tcg_ctx_00,ret,v0,v1,tcg_ctx_00->cpu_env);
      break;
    case 1:
      check_dsp_r2(ctx);
      gen_helper_dpaqx_s_w_ph(tcg_ctx_00,ret,v0,v1,tcg_ctx_00->cpu_env);
      break;
    case 2:
      check_dsp(ctx);
      gen_helper_dpsu_h_qbl(tcg_ctx_00,ret,v0,v1,tcg_ctx_00->cpu_env);
      break;
    case 3:
      check_dsp_r2(ctx);
      gen_helper_dpsqx_s_w_ph(tcg_ctx_00,ret,v0,v1,tcg_ctx_00->cpu_env);
      break;
    default:
      generate_exception_end(ctx,0x14);
      break;
    case 6:
      check_dsp_r2(ctx);
      gen_helper_mulsa_w_ph(tcg_ctx_00,ret,v0,v1,tcg_ctx_00->cpu_env);
    }
    break;
  case 3:
    uVar1 = extract32(ctx->opcode,9,3);
    switch(uVar1) {
    case 0:
      check_dsp(ctx);
      gen_helper_dpau_h_qbr(tcg_ctx_00,ret,v1,v0,tcg_ctx_00->cpu_env);
      break;
    case 1:
      check_dsp_r2(ctx);
      gen_helper_dpaqx_sa_w_ph(tcg_ctx_00,ret,v1,v0,tcg_ctx_00->cpu_env);
      break;
    case 2:
      check_dsp(ctx);
      gen_helper_dpsu_h_qbr(tcg_ctx_00,ret,v1,v0,tcg_ctx_00->cpu_env);
      break;
    case 3:
      check_dsp_r2(ctx);
      gen_helper_dpsqx_sa_w_ph(tcg_ctx_00,ret,v1,v0,tcg_ctx_00->cpu_env);
      break;
    default:
      generate_exception_end(ctx,0x14);
      break;
    case 6:
      check_dsp(ctx);
      gen_helper_mulsaq_s_w_ph(tcg_ctx_00,ret,v1,v0,tcg_ctx_00->cpu_env);
    }
    break;
  default:
    generate_exception_end(ctx,0x14);
  }
  tcg_temp_free_i32(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_pool32axf_2_multiply(DisasContext *ctx, uint32_t opc,
                                    TCGv v0, TCGv v1, int rd)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0;

    t0 = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_movi_i32(tcg_ctx, t0, rd >> 3);

    switch (opc) {
    case NM_POOL32AXF_2_0_7:
        switch (extract32(ctx->opcode, 9, 3)) {
        case NM_DPA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpa_w_ph(tcg_ctx, t0, v1, v0, tcg_ctx->cpu_env);
            break;
        case NM_DPAQ_S_W_PH:
            check_dsp(ctx);
            gen_helper_dpaq_s_w_ph(tcg_ctx, t0, v1, v0, tcg_ctx->cpu_env);
            break;
        case NM_DPS_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dps_w_ph(tcg_ctx, t0, v1, v0, tcg_ctx->cpu_env);
            break;
        case NM_DPSQ_S_W_PH:
            check_dsp(ctx);
            gen_helper_dpsq_s_w_ph(tcg_ctx, t0, v1, v0, tcg_ctx->cpu_env);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case NM_POOL32AXF_2_8_15:
        switch (extract32(ctx->opcode, 9, 3)) {
        case NM_DPAX_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpax_w_ph(tcg_ctx, t0, v0, v1, tcg_ctx->cpu_env);
            break;
        case NM_DPAQ_SA_L_W:
            check_dsp(ctx);
            gen_helper_dpaq_sa_l_w(tcg_ctx, t0, v0, v1, tcg_ctx->cpu_env);
            break;
        case NM_DPSX_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpsx_w_ph(tcg_ctx, t0, v0, v1, tcg_ctx->cpu_env);
            break;
        case NM_DPSQ_SA_L_W:
            check_dsp(ctx);
            gen_helper_dpsq_sa_l_w(tcg_ctx, t0, v0, v1, tcg_ctx->cpu_env);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case NM_POOL32AXF_2_16_23:
        switch (extract32(ctx->opcode, 9, 3)) {
        case NM_DPAU_H_QBL:
            check_dsp(ctx);
            gen_helper_dpau_h_qbl(tcg_ctx, t0, v0, v1, tcg_ctx->cpu_env);
            break;
        case NM_DPAQX_S_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpaqx_s_w_ph(tcg_ctx, t0, v0, v1, tcg_ctx->cpu_env);
            break;
        case NM_DPSU_H_QBL:
            check_dsp(ctx);
            gen_helper_dpsu_h_qbl(tcg_ctx, t0, v0, v1, tcg_ctx->cpu_env);
            break;
        case NM_DPSQX_S_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpsqx_s_w_ph(tcg_ctx, t0, v0, v1, tcg_ctx->cpu_env);
            break;
        case NM_MULSA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_mulsa_w_ph(tcg_ctx, t0, v0, v1, tcg_ctx->cpu_env);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    case NM_POOL32AXF_2_24_31:
        switch (extract32(ctx->opcode, 9, 3)) {
        case NM_DPAU_H_QBR:
            check_dsp(ctx);
            gen_helper_dpau_h_qbr(tcg_ctx, t0, v1, v0, tcg_ctx->cpu_env);
            break;
        case NM_DPAQX_SA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpaqx_sa_w_ph(tcg_ctx, t0, v1, v0, tcg_ctx->cpu_env);
            break;
        case NM_DPSU_H_QBR:
            check_dsp(ctx);
            gen_helper_dpsu_h_qbr(tcg_ctx, t0, v1, v0, tcg_ctx->cpu_env);
            break;
        case NM_DPSQX_SA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpsqx_sa_w_ph(tcg_ctx, t0, v1, v0, tcg_ctx->cpu_env);
            break;
        case NM_MULSAQ_S_W_PH:
            check_dsp(ctx);
            gen_helper_mulsaq_s_w_ph(tcg_ctx, t0, v1, v0, tcg_ctx->cpu_env);
            break;
        default:
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
    default:
        generate_exception_end(ctx, EXCP_RI);
        break;
    }

    tcg_temp_free_i32(tcg_ctx, t0);
}